

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O3

wchar_t scp_send_filename(char *name,uint64_t size,wchar_t permissions)

{
  Backend *pBVar1;
  FILE *stream;
  wchar_t wVar2;
  char *pcVar3;
  size_t sVar4;
  sftp_request *req;
  sftp_packet *pktin;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  fxp_attrs local_58;
  
  if (using_sftp) {
    if (scp_sftp_targetisdir) {
      pcVar3 = dupcat_fn(scp_sftp_remotepath,"/",name,0);
    }
    else {
      pcVar3 = dupstr(scp_sftp_remotepath);
    }
    if (permissions < L'\0') {
      local_58.flags = 0;
    }
    else {
      local_58.permissions = (unsigned_long)(uint)permissions;
      local_58.flags = 4;
    }
    req = fxp_open_send(pcVar3,0x1a,&local_58);
    pktin = sftp_wait_for_reply(req);
    scp_sftp_filehandle = fxp_open_recv(pktin,req);
    stream = _stderr;
    bVar7 = scp_sftp_filehandle == (fxp_handle *)0x0;
    if (bVar7) {
      pcVar5 = fxp_error();
      tell_user(stream,"pscp: unable to open %s: %s",pcVar3,pcVar5);
      safefree(pcVar3);
      errs = errs + L'\x01';
    }
    else {
      scp_sftp_fileoffset = 0;
      scp_sftp_xfer = xfer_upload_init(scp_sftp_filehandle,0);
      safefree(pcVar3);
    }
    return (uint)bVar7;
  }
  uVar6 = 0x1a4;
  if (L'\xffffffff' < permissions) {
    uVar6 = (ulong)(uint)(permissions & 0xfff);
  }
  pcVar3 = dupprintf("C%04o %lu ",uVar6,size);
  pBVar1 = backend;
  sVar4 = strlen(pcVar3);
  (*pBVar1->vt->send)(pBVar1,pcVar3,sVar4);
  safefree(pcVar3);
  pBVar1 = backend;
  sVar4 = strlen(name);
  (*pBVar1->vt->send)(pBVar1,name,sVar4);
  (*backend->vt->send)(backend,"\n",1);
  wVar2 = response();
  return wVar2;
}

Assistant:

int scp_send_filename(const char *name, uint64_t size, int permissions)
{
    if (using_sftp) {
        char *fullname;
        struct sftp_packet *pktin;
        struct sftp_request *req;
        struct fxp_attrs attrs;

        if (scp_sftp_targetisdir) {
            fullname = dupcat(scp_sftp_remotepath, "/", name);
        } else {
            fullname = dupstr(scp_sftp_remotepath);
        }

        attrs.flags = 0;
        PUT_PERMISSIONS(attrs, permissions);

        req = fxp_open_send(fullname,
                            SSH_FXF_WRITE | SSH_FXF_CREAT | SSH_FXF_TRUNC,
                            &attrs);
        pktin = sftp_wait_for_reply(req);
        scp_sftp_filehandle = fxp_open_recv(pktin, req);

        if (!scp_sftp_filehandle) {
            tell_user(stderr, "pscp: unable to open %s: %s",
                      fullname, fxp_error());
            sfree(fullname);
            errs++;
            return 1;
        }
        scp_sftp_fileoffset = 0;
        scp_sftp_xfer = xfer_upload_init(scp_sftp_filehandle,
                                         scp_sftp_fileoffset);
        sfree(fullname);
        return 0;
    } else {
        char *buf;
        if (permissions < 0)
            permissions = 0644;
        buf = dupprintf("C%04o %"PRIu64" ", (int)(permissions & 07777), size);
        backend_send(backend, buf, strlen(buf));
        sfree(buf);
        backend_send(backend, name, strlen(name));
        backend_send(backend, "\n", 1);
        return response();
    }
}